

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

bool __thiscall HighsSparseMatrix::debugPartitionOk(HighsSparseMatrix *this,int8_t *in_partition)

{
  int *piVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  HighsInt iEl;
  long lVar8;
  long lVar9;
  
  uVar2 = this->num_row_;
  piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  while (uVar6 = uVar5, uVar6 != uVar7) {
    lVar9 = (long)piVar3[uVar6];
    lVar8 = (long)(this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
    while (lVar9 < lVar8) {
      piVar1 = piVar4 + lVar9;
      lVar9 = lVar9 + 1;
      if (in_partition[*piVar1] == '\0') goto LAB_003630ae;
    }
    while (uVar5 = uVar6 + 1, lVar8 < piVar3[uVar6 + 1]) {
      piVar1 = piVar4 + lVar8;
      lVar8 = lVar8 + 1;
      if (in_partition[*piVar1] != '\0') goto LAB_003630ae;
    }
  }
LAB_003630ae:
  return (long)(int)uVar2 <= (long)uVar6;
}

Assistant:

bool HighsSparseMatrix::debugPartitionOk(const int8_t* in_partition) const {
  assert(this->format_ == MatrixFormat::kRowwisePartitioned);
  bool ok = true;
  for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
    for (HighsInt iEl = this->start_[iRow]; iEl < this->p_end_[iRow]; iEl++) {
      if (!in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
    for (HighsInt iEl = this->p_end_[iRow]; iEl < this->start_[iRow + 1];
         iEl++) {
      if (in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
  }
  return ok;
}